

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  int iVar1;
  metacall_log_custom_type custom_log;
  undefined1 local_40 [60];
  int local_4;
  
  local_4 = 0;
  memcpy(local_40,&PTR_context_00103d70,0x30);
  iVar1 = metacall_log(5,local_40);
  if (iVar1 == 0) {
    iVar1 = metacall_initialize();
    if (iVar1 == 0) {
      metacall_destroy();
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int, char *[])
{
	static const char context[] = "custom log";

	struct metacall_log_custom_type custom_log = {
		(void *)context,
		&format_size,
		&format_serialize,
		&format_deserialize,
		&stream_write,
		&stream_flush
	};

	if (metacall_log(METACALL_LOG_CUSTOM, (void *)&custom_log) != 0)
	{
		return 1;
	}

	if (metacall_initialize() != 0)
	{
		return 1;
	}

	/* Here you can load some scripts */

	metacall_destroy();

	return 0;
}